

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O0

void dlep_router_apply_interface_settings(dlep_router_if *interf)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  bool bVar4;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_extension *ext;
  dlep_router_if *interf_local;
  
  oonf_packet_apply_managed(&(interf->interf).udp,&(interf->interf).udp_config);
  _cleanup_interface(interf);
  bVar4 = true;
  if (interf != (dlep_router_if *)0xfffffffffffff3d0) {
    bVar4 = (interf->connect_to_addr)._type == '\0';
  }
  if (bVar4) {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }
  else {
    _connect_to_setup(interf);
  }
  paVar3 = dlep_extension_get_tree();
  plVar1 = (paVar3->list_head).next;
  while( true ) {
    plVar2 = plVar1->prev;
    paVar3 = dlep_extension_get_tree();
    if (plVar2 == (paVar3->list_head).prev) break;
    if (plVar1[-3].prev != (list_entity *)0x0) {
      (*(code *)plVar1[-3].prev)(interf);
    }
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
dlep_router_apply_interface_settings(struct dlep_router_if *interf) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interf->interf.udp, &interf->interf.udp_config);

  _cleanup_interface(interf);

  if (!netaddr_is_unspec(&interf->connect_to_addr)) {
    _connect_to_setup(interf);
  }
  else {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_router) {
      ext->cb_session_apply_router(&interf->interf.session);
    }
  }
}